

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O1

int __thiscall QTabWidgetPrivate::init(QTabWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QStackedWidget *pQVar1;
  void **ppvVar2;
  QTabWidgetPrivate *this_00;
  TabPosition TVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  undefined4 *puVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  aVar4.m_data = operator_new(0x28);
  QStackedWidget::QStackedWidget((QStackedWidget *)aVar4.m_data,parent);
  this->stack = (QStackedWidget *)aVar4;
  QVar7.m_size = (size_t)"qt_tabwidget_stackedwidget";
  QVar7.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar7);
  QFrame::setLineWidth(&this->stack->super_QFrame,0);
  QWidget::setSizePolicy((QWidget *)this->stack,(QSizePolicy)0xd550000);
  pQVar1 = this->stack;
  local_48 = QStackedWidget::widgetRemoved;
  local_40 = 0;
  local_58 = removeTab;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTabWidgetPrivate::*)(int),_QtPrivate::List<int>,_void>::
       impl;
  *(code **)(puVar5 + 4) = removeTab;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)pQVar1,(QObject *)&local_48,ppvVar2,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_60);
  aVar4.m_data = operator_new(0x28);
  QTabBar::QTabBar((QTabBar *)aVar4.m_data,parent);
  QVar8.m_size = (size_t)"qt_tabwidget_tabbar";
  QVar8.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar8);
  QTabBar::setDrawBase((QTabBar *)aVar4.m_data,false);
  QTabWidget::setTabBar((QTabWidget *)parent,(QTabBar *)aVar4.m_data);
  QWidget::setSizePolicy(parent,(QSizePolicy)0xd770000);
  QWidget::setFocusPolicy(parent,TabFocus);
  QWidget::setFocusProxy(parent,&this->tabs->super_QWidget);
  pQVar6 = QWidget::style(parent);
  TVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x56,0,parent,0);
  this_00 = *(QTabWidgetPrivate **)&parent->field_0x8;
  if (this_00->pos != TVar3) {
    this_00->pos = TVar3;
    updateTabBarPosition(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidgetPrivate::init()
{
    Q_Q(QTabWidget);

    stack = new QStackedWidget(q);
    stack->setObjectName("qt_tabwidget_stackedwidget"_L1);
    stack->setLineWidth(0);
    // hack so that QMacStyle::layoutSpacing() can detect tab widget pages
    stack->setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred, QSizePolicy::TabWidget));

    QObjectPrivate::connect(stack, &QStackedWidget::widgetRemoved, this, &QTabWidgetPrivate::removeTab);
    QTabBar *tabBar = new QTabBar(q);
    tabBar->setObjectName("qt_tabwidget_tabbar"_L1);
    tabBar->setDrawBase(false);
    q->setTabBar(tabBar);

    q->setSizePolicy(QSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding,
                                 QSizePolicy::TabWidget));
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setFocusPolicy(Qt::NoFocus);
    else
#endif
    q->setFocusPolicy(Qt::TabFocus);
    q->setFocusProxy(tabs);
    q->setTabPosition(static_cast<QTabWidget::TabPosition> (q->style()->styleHint(
                      QStyle::SH_TabWidget_DefaultTabPosition, nullptr, q )));

}